

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O0

pair<slang::syntax::MacroActualArgumentListSyntax_*,_slang::parsing::Trivia> * __thiscall
slang::parsing::Preprocessor::handleTopLevelMacro(Preprocessor *this,Token directive)

{
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens_00;
  SourceRange range;
  string_view arg;
  Token prevToken;
  Token prevToken_00;
  Token usageSite;
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  bool bVar2;
  uint n_;
  int iVar4;
  bool bVar3;
  undefined8 *puVar5;
  DefineDirectiveSyntax **ppDVar6;
  size_t sVar7;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
  *this_00;
  group_type *pgVar8;
  value_type *ppDVar9;
  equal_to<const_slang::syntax::DefineDirectiveSyntax_*> *this_01;
  DefineDirectiveSyntax **__y;
  undefined4 extraout_var;
  pointer pTVar10;
  iterator pTVar11;
  Info *in_RCX;
  undefined8 in_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *src_00;
  undefined8 *in_RSI;
  pair<slang::syntax::MacroActualArgumentListSyntax_*,_slang::parsing::Trivia> *in_RDI;
  MacroDef MVar12;
  Token TVar13;
  SmallVectorBase<slang::parsing::Token> *in_stack_00000098;
  Preprocessor *in_stack_000000a0;
  span<const_slang::parsing::Token,_18446744073709551615UL> in_stack_000000a8;
  Token *ptr;
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens;
  SmallSet<const_slang::syntax::DefineDirectiveSyntax_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
  alreadyExpanded;
  MacroExpansion expansion;
  SmallVector<slang::parsing::Token,_32UL> buffer;
  MacroActualArgumentListSyntax *actualArgs;
  SmallVector<slang::parsing::Token,_4UL> ignoreTokens;
  MacroDef macro;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  locator loc;
  size_t pos0;
  size_t hash_1;
  DefineDirectiveSyntax **k;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  undefined4 in_stack_fffffffffffff708;
  undefined4 uVar14;
  undefined4 in_stack_fffffffffffff70c;
  TriviaKind kind;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
  *in_stack_fffffffffffff710;
  undefined6 in_stack_fffffffffffff718;
  TokenKind in_stack_fffffffffffff71e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff720;
  span<const_slang::parsing::Token,_18446744073709551615UL> *this_02;
  undefined7 in_stack_fffffffffffff728;
  undefined1 in_stack_fffffffffffff72f;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
  *in_stack_fffffffffffff730;
  undefined7 in_stack_fffffffffffff750;
  undefined1 in_stack_fffffffffffff757;
  size_t in_stack_fffffffffffff758;
  char *in_stack_fffffffffffff760;
  undefined4 in_stack_fffffffffffff770;
  uint uVar15;
  undefined1 *hash_00;
  Preprocessor *in_stack_fffffffffffff780;
  undefined8 in_stack_fffffffffffff788;
  Info *in_stack_fffffffffffff790;
  undefined1 *puVar16;
  Trivia local_7c8 [3];
  Trivia local_798;
  pointer local_788;
  undefined8 local_780;
  MacroParser *in_stack_fffffffffffff888;
  pointer in_stack_fffffffffffff890;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff898;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_760 [4];
  undefined1 local_700 [56];
  Trivia local_6c8;
  DefineDirectiveSyntax *local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  Info *pIStack_6a0;
  MacroExpansion local_698;
  SmallVectorBase<slang::parsing::Token> local_668 [13];
  Trivia local_450;
  void *local_440;
  undefined8 local_438;
  Info *local_430;
  MacroActualArgumentListSyntax *local_408;
  Trivia local_400;
  void *local_3f0;
  Trivia local_3e8;
  undefined8 local_3d8;
  Info *local_3d0;
  MacroActualArgumentListSyntax *local_3a8;
  string_view local_3a0;
  SourceRange local_390;
  undefined4 local_37c;
  SmallSet<const_slang::syntax::DefineDirectiveSyntax_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
  *in_stack_fffffffffffffc88;
  span<const_slang::parsing::Token,_18446744073709551615UL> *in_stack_fffffffffffffc90;
  Preprocessor *in_stack_fffffffffffffc98;
  Trivia local_358;
  void *local_348;
  undefined4 local_33c;
  Trivia local_338;
  void *local_328;
  Token local_320;
  Token local_310;
  SmallVectorBase<slang::parsing::Token> local_2f0 [2];
  iterator local_298;
  string_view local_288;
  basic_string_view<char,_std::char_traits<char>_> local_278;
  char_pointer local_268;
  table_element_pointer local_260;
  MacroDef local_258;
  MacroDef local_230;
  undefined8 local_218;
  Info *pIStack_210;
  basic_string_view<char,_std::char_traits<char>_> *local_208;
  undefined8 *local_200;
  char_pointer local_1f8;
  table_element_pointer local_1f0;
  MacroDef *local_1e8;
  undefined1 *local_1e0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_1d8;
  basic_string_view<char,_std::char_traits<char>_> *local_1c0;
  undefined8 *local_1b8;
  iterator local_1b0;
  size_t local_1a0;
  basic_string_view<char,_std::char_traits<char>_> *local_198;
  undefined8 *local_190;
  uint local_184;
  value_type *local_180;
  value_type *local_178;
  uint local_16c;
  group_type *local_168;
  size_t local_160;
  pow2_quadratic_prober local_158;
  size_t local_148;
  size_t local_140;
  basic_string_view<char,_std::char_traits<char>_> *local_138;
  undefined8 *local_130;
  MacroDef *local_128;
  undefined1 *local_120;
  bool local_111 [25];
  iterator local_f8;
  bool local_e1 [33];
  undefined7 in_stack_ffffffffffffff48;
  bool in_stack_ffffffffffffff4f;
  Preprocessor *in_stack_ffffffffffffff50;
  DefineDirectiveSyntax *in_stack_ffffffffffffff58;
  group15<boost::unordered::detail::foa::plain_integral> *in_stack_ffffffffffffff60;
  uint local_44;
  pow2_quadratic_prober local_30;
  size_t local_20;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
  *local_18;
  DefineDirectiveSyntax **local_10;
  undefined1 *local_8;
  
  TVar13.info = in_stack_fffffffffffff790;
  TVar13._0_8_ = in_stack_fffffffffffff788;
  local_218 = in_RDX;
  pIStack_210 = in_RCX;
  MVar12 = findMacro(in_stack_fffffffffffff780,TVar13);
  local_258.syntax = MVar12.syntax;
  local_230.syntax = local_258.syntax;
  local_258.intrinsic = MVar12.intrinsic;
  local_230.intrinsic = local_258.intrinsic;
  local_258._12_2_ = MVar12._12_2_;
  local_230.builtIn = local_258.builtIn;
  local_230.commandLine = local_258.commandLine;
  local_258 = MVar12;
  bVar2 = MacroDef::valid(&local_230);
  if (bVar2) {
    local_408 = (MacroActualArgumentListSyntax *)0x0;
    bVar2 = MacroDef::needsArgs(&local_230);
    if (bVar2) {
      MacroParser::MacroParser
                ((MacroParser *)in_stack_fffffffffffff710,
                 (Preprocessor *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
      local_438 = local_218;
      local_430 = pIStack_210;
      prevToken_00.info = (Info *)in_stack_fffffffffffff898._M_extent_value;
      prevToken_00._0_8_ = in_stack_fffffffffffff890;
      local_408 = MacroParser::parseActualArgumentList(in_stack_fffffffffffff888,prevToken_00);
      if (local_408 == (MacroActualArgumentListSyntax *)0x0) {
        local_440 = (void *)0x0;
        Trivia::Trivia(&local_450);
        std::pair<slang::syntax::MacroActualArgumentListSyntax_*,_slang::parsing::Trivia>::
        pair<std::nullptr_t,_slang::parsing::Trivia,_true>(in_RDI,&local_440,&local_450);
        return in_RDI;
      }
    }
    SmallVector<slang::parsing::Token,_32UL>::SmallVector
              ((SmallVector<slang::parsing::Token,_32UL> *)0x36d337);
    local_6a8 = local_218;
    pIStack_6a0 = pIStack_210;
    usageSite.info = pIStack_210;
    usageSite.kind = (undefined2)local_218;
    usageSite._2_1_ = local_218._2_1_;
    usageSite.numFlags.raw = local_218._3_1_;
    usageSite.rawLen = local_218._4_4_;
    uVar14 = 1;
    MacroExpansion::MacroExpansion
              (&local_698,(SourceManager *)*in_RSI,(BumpAllocator *)in_RSI[1],local_668,usageSite,
               true);
    uStack_6b0 = CONCAT26(local_230._14_2_,CONCAT24(local_230._12_2_,local_230.intrinsic));
    local_6b8 = local_230.syntax;
    MVar12._8_8_ = in_stack_ffffffffffffff60;
    MVar12.syntax = in_stack_ffffffffffffff58;
    bVar2 = expandMacro(in_stack_ffffffffffffff50,MVar12,
                        (MacroExpansion *)
                        CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                        local_e1._33_8_);
    if (bVar2) {
      SmallSet<const_slang::syntax::DefineDirectiveSyntax_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
      ::SmallSet((SmallSet<const_slang::syntax::DefineDirectiveSyntax_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                  *)in_stack_fffffffffffff720._M_extent_value);
      bVar2 = MacroDef::isIntrinsic(&local_230);
      src_00 = extraout_RDX;
      if (!bVar2) {
        hash_00 = local_700;
        local_1e8 = &local_230;
        local_1e0 = hash_00;
        local_128 = local_1e8;
        local_120 = hash_00;
        ppDVar6 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
                  ::key_from<slang::syntax::DefineDirectiveSyntax_const*>
                            ((DefineDirectiveSyntax **)0x36d4e3);
        sVar7 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
                ::hash_for<slang::syntax::DefineDirectiveSyntax_const*>
                          (in_stack_fffffffffffff710,
                           (DefineDirectiveSyntax **)CONCAT44(in_stack_fffffffffffff70c,uVar14));
        this_00 = (table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                   *)boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                     ::position_for(in_stack_fffffffffffff710,
                                    CONCAT44(in_stack_fffffffffffff70c,uVar14));
        puVar16 = hash_00;
        local_20 = sVar7;
        local_18 = this_00;
        local_10 = ppDVar6;
        local_8 = hash_00;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_30,(size_t)this_00);
        do {
          sVar7 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
          pgVar8 = boost::unordered::detail::foa::
                   table_arrays<const_slang::syntax::DefineDirectiveSyntax_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                   ::groups((table_arrays<const_slang::syntax::DefineDirectiveSyntax_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                             *)0x36d5da);
          local_44 = boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::match
                               ((group15<boost::unordered::detail::foa::plain_integral> *)
                                CONCAT26(in_stack_fffffffffffff71e,in_stack_fffffffffffff718),
                                (size_t)in_stack_fffffffffffff710);
          uVar15 = local_44;
          if (local_44 != 0) {
            ppDVar9 = boost::unordered::detail::foa::
                      table_arrays<const_slang::syntax::DefineDirectiveSyntax_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                      ::elements((table_arrays<const_slang::syntax::DefineDirectiveSyntax_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                                  *)0x36d633);
            do {
              n_ = boost::unordered::detail::foa::unchecked_countr_zero(0);
              this_01 = boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                        ::pred((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                                *)0x36d683);
              ppDVar6 = local_10;
              __y = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
                    ::key_from<slang::syntax::DefineDirectiveSyntax_const*>
                              ((DefineDirectiveSyntax **)0x36d6ad);
              bVar2 = std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>::operator()
                                (this_01,ppDVar6,__y);
              if (bVar2) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::syntax::DefineDirectiveSyntax_*>
                ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::syntax::DefineDirectiveSyntax_*>
                                 *)&stack0xffffffffffffff60,pgVar8 + sVar7,n_,
                                ppDVar9 + sVar7 * 0xf + (ulong)n_);
                goto LAB_0036d7b4;
              }
              local_44 = local_44 - 1 & local_44;
            } while (local_44 != 0);
          }
          bVar2 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffff710,CONCAT44(in_stack_fffffffffffff70c,uVar14));
          if (bVar2) {
            memset(&stack0xffffffffffffff60,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::syntax::DefineDirectiveSyntax_*>
            ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::syntax::DefineDirectiveSyntax_*>
                             *)&stack0xffffffffffffff60);
            goto LAB_0036d7b4;
          }
          bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_30,*(size_t *)(hash_00 + 0x10));
        } while (bVar2);
        memset(&stack0xffffffffffffff60,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::syntax::DefineDirectiveSyntax_*>
        ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::syntax::DefineDirectiveSyntax_*>
                         *)&stack0xffffffffffffff60);
LAB_0036d7b4:
        bVar2 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                          ((table_locator *)&stack0xffffffffffffff60);
        if (bVar2) {
          boost::unordered::detail::foa::
          table<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
          ::make_iterator((locator *)0x36d7d6);
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (local_760,
                     (table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)&stack0xffffffffffffff50,(bool *)&stack0xffffffffffffff4f);
          src_00 = extraout_RDX_00;
        }
        else if (*(ulong *)(puVar16 + 0x30) < *(ulong *)(puVar16 + 0x28)) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
          ::unchecked_emplace_at<slang::syntax::DefineDirectiveSyntax_const*const&>
                    (in_stack_fffffffffffff730,
                     CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),
                     in_stack_fffffffffffff720._M_extent_value,
                     (DefineDirectiveSyntax **)
                     CONCAT26(in_stack_fffffffffffff71e,in_stack_fffffffffffff718));
          join_0x00000010_0x00000000_ =
               boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
               ::make_iterator((locator *)0x36d85e);
          local_e1[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (local_760,
                     (table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)(local_e1 + 0x19),local_e1);
          src_00 = extraout_RDX_01;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
          ::unchecked_emplace_with_rehash<slang::syntax::DefineDirectiveSyntax_const*const&>
                    (this_00,(size_t)hash_00,
                     (DefineDirectiveSyntax **)CONCAT44(uVar15,in_stack_fffffffffffff770));
          local_f8 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                     ::make_iterator((locator *)0x36d8c9);
          local_111[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (local_760,&local_f8,local_111);
          src_00 = extraout_RDX_02;
        }
      }
      iVar4 = SmallVectorBase<slang::parsing::Token>::copy
                        (local_668,(EVP_PKEY_CTX *)in_RSI[1],src_00);
      local_780 = CONCAT44(extraout_var,iVar4);
      std::span<const_slang::parsing::Token,_18446744073709551615UL>::
      span<slang::parsing::Token,_18446744073709551615UL>
                ((span<const_slang::parsing::Token,_18446744073709551615UL> *)
                 in_stack_fffffffffffff720._M_extent_value,
                 (span<slang::parsing::Token,_18446744073709551615UL> *)
                 CONCAT26(in_stack_fffffffffffff71e,in_stack_fffffffffffff718));
      while( true ) {
        local_788 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::data
                              ((span<const_slang::parsing::Token,_18446744073709551615UL> *)
                               &stack0xfffffffffffff890);
        bVar2 = expandReplacementList
                          (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                           in_stack_fffffffffffffc88);
        if (!bVar2) break;
        this_02 = (span<const_slang::parsing::Token,_18446744073709551615UL> *)(in_RSI + 0x33);
        SmallVectorBase<slang::parsing::Token>::clear
                  ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffff710);
        bVar2 = applyMacroOps(in_stack_000000a0,in_stack_000000a8,in_stack_00000098);
        if (!bVar2) {
          in_stack_fffffffffffff718 = SUB86(local_788,0);
          in_stack_fffffffffffff71e = (TokenKind)((ulong)local_788 >> 0x30);
          pTVar10 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::data
                              ((span<const_slang::parsing::Token,_18446744073709551615UL> *)
                               &stack0xfffffffffffff890);
          if ((pointer)CONCAT26(in_stack_fffffffffffff71e,in_stack_fffffffffffff718) == pTVar10) {
            bVar2 = SmallVectorBase<slang::parsing::Token>::empty
                              ((SmallVectorBase<slang::parsing::Token> *)(in_RSI + 0x33));
            if (!bVar2) {
              pTVar11 = SmallVectorBase<slang::parsing::Token>::begin
                                  ((SmallVectorBase<slang::parsing::Token> *)(in_RSI + 0x33));
              in_RSI[0x3a] = pTVar11;
            }
            Trivia::Trivia(local_7c8);
            std::pair<slang::syntax::MacroActualArgumentListSyntax_*,_slang::parsing::Trivia>::
            pair<slang::syntax::MacroActualArgumentListSyntax_*&,_slang::parsing::Trivia,_true>
                      (in_RDI,&local_408,local_7c8);
            goto LAB_0036db40;
          }
        }
        std::span<const_slang::parsing::Token,_18446744073709551615UL>::
        span<slang::SmallVector<slang::parsing::Token,_2UL>_&>
                  (this_02,(SmallVector<slang::parsing::Token,_2UL> *)
                           CONCAT26(in_stack_fffffffffffff71e,in_stack_fffffffffffff718));
      }
      Trivia::Trivia(&local_798);
      std::pair<slang::syntax::MacroActualArgumentListSyntax_*,_slang::parsing::Trivia>::
      pair<slang::syntax::MacroActualArgumentListSyntax_*&,_slang::parsing::Trivia,_true>
                (in_RDI,&local_408,&local_798);
LAB_0036db40:
      local_33c = 1;
      SmallSet<const_slang::syntax::DefineDirectiveSyntax_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
      ::~SmallSet((SmallSet<const_slang::syntax::DefineDirectiveSyntax_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                   *)0x36db4d);
    }
    else {
      Trivia::Trivia(&local_6c8);
      std::pair<slang::syntax::MacroActualArgumentListSyntax_*,_slang::parsing::Trivia>::
      pair<slang::syntax::MacroActualArgumentListSyntax_*&,_slang::parsing::Trivia,_true>
                (in_RDI,&local_408,&local_6c8);
      local_33c = 1;
    }
    SmallVector<slang::parsing::Token,_32UL>::~SmallVector
              ((SmallVector<slang::parsing::Token,_32UL> *)0x36db5a);
  }
  else {
    puVar5 = in_RSI + 0x11;
    local_288 = Token::valueText((Token *)in_stack_fffffffffffff720._M_extent_value);
    local_278 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff730,
                           CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),
                           in_stack_fffffffffffff720._M_extent_value);
    local_208 = &local_278;
    local_200 = puVar5;
    local_1c0 = local_208;
    local_1b8 = puVar5;
    local_198 = local_208;
    local_190 = puVar5;
    local_1a0 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                          ((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)in_stack_fffffffffffff710,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
    pbVar1 = local_198;
    local_140 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                *)in_stack_fffffffffffff710,
                               CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
    local_138 = pbVar1;
    local_148 = local_1a0;
    local_130 = puVar5;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
              (&local_158,local_140);
    do {
      local_160 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_158);
      local_168 = boost::unordered::detail::foa::
                  table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::groups((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)0x36cc34);
      local_168 = local_168 + local_160;
      local_16c = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             CONCAT26(in_stack_fffffffffffff71e,in_stack_fffffffffffff718),
                             (size_t)in_stack_fffffffffffff710);
      if (local_16c != 0) {
        local_178 = boost::unordered::detail::foa::
                    table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::elements((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                *)0x36cc82);
        local_180 = local_178 + local_160 * 0xf;
        do {
          local_184 = boost::unordered::detail::foa::unchecked_countr_zero(0);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::pred((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)0x36ccd5);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                    ((basic_string_view<char,_std::char_traits<char>_> *)0x36cd08);
          bVar2 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             in_stack_fffffffffffff730,
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffff720._M_extent_value);
          if (bVar2) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ::table_locator(&local_1d8,local_168,local_184,local_180 + local_184);
            goto LAB_0036ce05;
          }
          local_16c = local_16c - 1 & local_16c;
        } while (local_16c != 0);
      }
      bVar2 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffff710,
                                  CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
      if (bVar2) {
        memset(&local_1d8,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        ::table_locator(&local_1d8);
        goto LAB_0036ce05;
      }
      bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_158,in_RSI[0x12]);
    } while (bVar2);
    memset(&local_1d8,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::table_locator(&local_1d8);
LAB_0036ce05:
    local_1b0 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::make_iterator((locator *)0x36ce12);
    local_1f8 = local_1b0.pc_;
    local_1f0 = local_1b0.p_;
    local_268 = local_1b0.pc_;
    local_260 = local_1b0.p_;
    local_298 = boost::unordered::
                unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::end((unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)0x36ce77);
    bVar2 = boost::unordered::detail::foa::operator!=
                      ((table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_stack_fffffffffffff710,
                       (table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
    if (bVar2) {
      SmallVector<slang::parsing::Token,_4UL>::SmallVector
                ((SmallVector<slang::parsing::Token,_4UL> *)0x36ceb2);
      while( true ) {
        bVar3 = peekSameLine((Preprocessor *)
                             CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
        bVar2 = false;
        if (bVar3) {
          TVar13 = peek((Preprocessor *)
                        CONCAT26(in_stack_fffffffffffff71e,in_stack_fffffffffffff718));
          local_310.kind = TVar13.kind;
          bVar2 = local_310.kind != EndOfFile;
          local_310 = TVar13;
        }
        if (!bVar2) break;
        TVar13 = consume((Preprocessor *)in_stack_fffffffffffff720._M_extent_value);
        local_320 = TVar13;
        SmallVectorBase<slang::parsing::Token>::push_back
                  ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffff710,
                   (Token *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
      }
      bVar2 = SmallVectorBase<slang::parsing::Token>::empty(local_2f0);
      kind = (TriviaKind)((uint)in_stack_fffffffffffff70c >> 0x18);
      if (bVar2) {
        local_328 = (void *)0x0;
        Trivia::Trivia(&local_338);
        std::pair<slang::syntax::MacroActualArgumentListSyntax_*,_slang::parsing::Trivia>::
        pair<std::nullptr_t,_slang::parsing::Trivia,_true>(in_RDI,&local_328,&local_338);
      }
      else {
        local_348 = (void *)0x0;
        SmallVectorBase<slang::parsing::Token>::copy(local_2f0,(EVP_PKEY_CTX *)in_RSI[1],src);
        std::span<const_slang::parsing::Token,_18446744073709551615UL>::
        span<slang::parsing::Token,_18446744073709551615UL>
                  ((span<const_slang::parsing::Token,_18446744073709551615UL> *)
                   in_stack_fffffffffffff720._M_extent_value,
                   (span<slang::parsing::Token,_18446744073709551615UL> *)
                   CONCAT26(in_stack_fffffffffffff71e,in_stack_fffffffffffff718));
        tokens_00._M_ptr._6_2_ = in_stack_fffffffffffff71e;
        tokens_00._M_ptr._0_6_ = in_stack_fffffffffffff718;
        tokens_00._M_extent._M_extent_value = in_stack_fffffffffffff720._M_extent_value;
        Trivia::Trivia((Trivia *)in_stack_fffffffffffff710,kind,tokens_00);
        std::pair<slang::syntax::MacroActualArgumentListSyntax_*,_slang::parsing::Trivia>::
        pair<std::nullptr_t,_slang::parsing::Trivia,_true>(in_RDI,&local_348,&local_358);
      }
      local_33c = 1;
      SmallVector<slang::parsing::Token,_4UL>::~SmallVector
                ((SmallVector<slang::parsing::Token,_4UL> *)0x36d0e6);
    }
    else {
      local_37c = 0x1a0004;
      local_390 = Token::range((Token *)in_stack_fffffffffffff730);
      range.endLoc._0_7_ = in_stack_fffffffffffff728;
      range.startLoc = (SourceLocation)in_stack_fffffffffffff720._M_extent_value;
      range.endLoc._7_1_ = in_stack_fffffffffffff72f;
      addDiag((Preprocessor *)CONCAT26(in_stack_fffffffffffff71e,in_stack_fffffffffffff718),
              SUB84((ulong)in_stack_fffffffffffff730 >> 0x20,0),range);
      local_3a0 = Token::valueText((Token *)in_stack_fffffffffffff720._M_extent_value);
      arg._M_str = in_stack_fffffffffffff760;
      arg._M_len = in_stack_fffffffffffff758;
      Diagnostic::operator<<
                ((Diagnostic *)CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),arg);
      bVar2 = peek((Preprocessor *)in_stack_fffffffffffff720._M_extent_value,
                   in_stack_fffffffffffff71e);
      if (bVar2) {
        MacroParser::MacroParser
                  ((MacroParser *)in_stack_fffffffffffff710,
                   (Preprocessor *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
        local_3d8 = local_218;
        local_3d0 = pIStack_210;
        prevToken.info = (Info *)in_stack_fffffffffffff898._M_extent_value;
        prevToken._0_8_ = in_stack_fffffffffffff890;
        local_3a8 = MacroParser::parseActualArgumentList(in_stack_fffffffffffff888,prevToken);
        Trivia::Trivia(&local_3e8);
        std::pair<slang::syntax::MacroActualArgumentListSyntax_*,_slang::parsing::Trivia>::
        pair<slang::syntax::MacroActualArgumentListSyntax_*,_slang::parsing::Trivia,_true>
                  (in_RDI,&local_3a8,&local_3e8);
      }
      else {
        local_3f0 = (void *)0x0;
        Trivia::Trivia(&local_400);
        std::pair<slang::syntax::MacroActualArgumentListSyntax_*,_slang::parsing::Trivia>::
        pair<std::nullptr_t,_slang::parsing::Trivia,_true>(in_RDI,&local_3f0,&local_400);
      }
    }
  }
  return in_RDI;
}

Assistant:

std::pair<MacroActualArgumentListSyntax*, Trivia> Preprocessor::handleTopLevelMacro(
    Token directive) {
    auto macro = findMacro(directive);
    if (!macro.valid()) {
        if (options.ignoreDirectives.find(directive.valueText().substr(1)) !=
            options.ignoreDirectives.end()) {
            SmallVector<Token, 4> ignoreTokens;
            while (peekSameLine() && peek().kind != TokenKind::EndOfFile)
                ignoreTokens.push_back(consume());

            if (ignoreTokens.empty())
                return {nullptr, Trivia()};
            else
                return {nullptr, Trivia(TriviaKind::SkippedTokens, ignoreTokens.copy(alloc))};
        }
        addDiag(diag::UnknownDirective, directive.range()) << directive.valueText();

        // If we see a parenthesis next, let's assume they tried to invoke a function-like macro
        // and skip over the tokens.
        if (peek(TokenKind::OpenParenthesis))
            return {MacroParser(*this).parseActualArgumentList(directive), Trivia()};
        return {nullptr, Trivia()};
    }

    // if this assert fires, we failed to fully expand nested macros at a previous point
    SLANG_ASSERT(!currentMacroToken);

    // parse arguments if necessary
    MacroActualArgumentListSyntax* actualArgs = nullptr;
    if (macro.needsArgs()) {
        actualArgs = MacroParser(*this).parseActualArgumentList(directive);
        if (!actualArgs)
            return {nullptr, Trivia()};
    }

    // Expand out the macro
    SmallVector<Token, 32> buffer;
    MacroExpansion expansion{sourceManager, alloc, buffer, directive, true};
    if (!expandMacro(macro, expansion, actualArgs))
        return {actualArgs, Trivia()};

    // The macro is now expanded out into tokens, but some of those tokens might
    // be more macros that need to be expanded, or special characters that
    // perform stringification or concatenation of tokens. It's possible that
    // after concatentation is performed we will have formed new valid macro
    // names that need to be expanded, which is why we loop here.
    SmallSet<const DefineDirectiveSyntax*, 8> alreadyExpanded;
    if (!macro.isIntrinsic())
        alreadyExpanded.insert(macro.syntax);

    std::span<Token const> tokens = buffer.copy(alloc);
    while (true) {
        // Start by recursively expanding out all valid macro usages. We keep track of
        // the token pointer here so that we can detect if expandReplacementList actually
        // did any work; if it did we want to ensure that we come back around for another
        // pass. This ensures that we don't miss expanding a constructed macro.
        const Token* ptr = tokens.data();
        if (!expandReplacementList(tokens, alreadyExpanded))
            return {actualArgs, Trivia()};

        // Now that all macros have been expanded, handle token concatenation and stringification.
        expandedTokens.clear();
        if (!applyMacroOps(tokens, expandedTokens) && ptr == tokens.data())
            break;

        tokens = expandedTokens;
    }

    // if the macro expanded into any tokens at all, set the pointer
    // so that we'll pull from them next
    if (!expandedTokens.empty())
        currentMacroToken = expandedTokens.begin();

    return {actualArgs, Trivia()};
}